

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O0

MPP_RET vepu580_h265_setup_hal_bufs(H265eV580HalContext *ctx)

{
  int iVar1;
  VepuFmtCfg *cfg;
  MppEncRefCfg ref;
  MppEncCfgSet *pMVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  RK_S32 local_74;
  int local_6c;
  size_t local_68;
  size_t size [3];
  MppEncCpbInfo *info;
  RK_S32 new_max_cnt;
  RK_S32 old_max_cnt;
  MppEncPrepCfg *prep;
  MppEncRefCfg ref_cfg;
  RK_S32 mb_h64;
  RK_S32 mb_wd64;
  RK_U32 frame_size;
  VepuFmtCfg *fmt;
  MPP_RET ret;
  H265eV580HalContext *ctx_local;
  
  cfg = (VepuFmtCfg *)ctx->input_fmt;
  ref = ctx->cfg->ref_cfg;
  pMVar2 = ctx->cfg;
  iVar1 = ctx->max_buf_cnt;
  info._0_4_ = 4;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0x16c);
  }
  iVar3 = ((pMVar2->prep).width + 0x3f) / 0x40;
  iVar4 = ((pMVar2->prep).height + 0x3f) / 0x40 + 1;
  uVar5 = ((pMVar2->prep).width + 0xfU & 0xfffffff0) * ((pMVar2->prep).height + 0xfU & 0xfffffff0);
  vepu541_set_fmt(cfg,(ctx->cfg->prep).format);
  if (ref != (MppEncRefCfg)0x0) {
    size[2] = (size_t)mpp_enc_ref_cfg_get_cpb_info(ref);
    if (((MppEncCpbInfo *)size[2])->dpb_size + 1 < 4) {
      local_6c = 4;
    }
    else {
      local_6c = ((MppEncCpbInfo *)size[2])->dpb_size + 1;
    }
    info._0_4_ = local_6c;
  }
  if ((ctx->frame_size < uVar5) || (iVar1 < (int)info)) {
    memset(&local_68,0,0x18);
    hal_bufs_deinit(ctx->dpb_bufs);
    hal_bufs_init(&ctx->dpb_bufs);
    ctx->fbc_header_len = iVar3 * iVar4 * 0x40 + 0x1fffU & 0xffffe000;
    local_68 = (size_t)(ctx->fbc_header_len + (iVar3 * iVar4 * 0x3000) / 2);
    size[0] = (size_t)(iVar3 * iVar4 * 0x100);
    size[1] = (size_t)(int)(iVar3 * iVar4 * 0x60 + 0xffU & 0xffffff00);
    local_74 = iVar1;
    if (iVar1 < (int)info) {
      local_74 = (int)info;
    }
    if ((hal_h265e_debug & 8) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","frame size %d -> %d max count %d -> %d\n",(char *)0x0,
                 (ulong)ctx->frame_size,(ulong)uVar5,iVar1,local_74);
    }
    hal_bufs_setup(ctx->dpb_bufs,local_74,3,&local_68);
    ctx->frame_size = uVar5;
    ctx->max_buf_cnt = local_74;
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0x18d);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET vepu580_h265_setup_hal_bufs(H265eV580HalContext *ctx)
{
    MPP_RET ret = MPP_OK;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    RK_U32 frame_size;
    RK_S32 mb_wd64, mb_h64;
    MppEncRefCfg ref_cfg = ctx->cfg->ref_cfg;
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    RK_S32 old_max_cnt = ctx->max_buf_cnt;
    RK_S32 new_max_cnt = 4;

    hal_h265e_enter();

    mb_wd64 = (prep->width + 63) / 64;
    mb_h64 = (prep->height + 63) / 64 + 1;

    frame_size = MPP_ALIGN(prep->width, 16) * MPP_ALIGN(prep->height, 16);
    vepu541_set_fmt(fmt, ctx->cfg->prep.format);

    if (ref_cfg) {
        MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
        new_max_cnt = MPP_MAX(new_max_cnt, info->dpb_size + 1);
    }

    if (frame_size > ctx->frame_size || new_max_cnt > old_max_cnt) {
        size_t size[3] = {0};

        hal_bufs_deinit(ctx->dpb_bufs);
        hal_bufs_init(&ctx->dpb_bufs);

        ctx->fbc_header_len = MPP_ALIGN(((mb_wd64 * mb_h64) << 6), SZ_8K);
        size[0] = ctx->fbc_header_len + ((mb_wd64 * mb_h64) << 12) * 3 / 2; //fbc_h + fbc_b
        size[1] = (mb_wd64 * mb_h64 << 8);
        size[2] = MPP_ALIGN(mb_wd64 * mb_h64 * 16 * 6, 256);
        new_max_cnt = MPP_MAX(new_max_cnt, old_max_cnt);

        hal_h265e_dbg_detail("frame size %d -> %d max count %d -> %d\n",
                             ctx->frame_size, frame_size, old_max_cnt, new_max_cnt);

        hal_bufs_setup(ctx->dpb_bufs, new_max_cnt, 3, size);

        ctx->frame_size = frame_size;
        ctx->max_buf_cnt = new_max_cnt;
    }
    hal_h265e_leave();
    return ret;
}